

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O1

int getSurfaceHeight(double *ncol00,double *ncol01,double *ncol10,double *ncol11,int colymin,
                    int colymax,int blockspercell,double dx,double dz)

{
  int iVar1;
  int in_EAX;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  lVar4 = (long)colymax;
  iVar5 = colymax * blockspercell + -1;
  do {
    if (lVar4 <= colymin) {
      return 0;
    }
    lVar4 = lVar4 + -1;
    lVar2 = lVar4 - colymin;
    iVar1 = blockspercell;
    iVar6 = iVar5;
    do {
      iVar3 = iVar1;
      if (iVar3 < 1) break;
      dVar7 = (double)(iVar3 + -1) / (double)blockspercell;
      dVar8 = dVar7 * (ncol01[lVar2 + 1] - ncol01[lVar2]) + ncol01[lVar2];
      dVar9 = dVar7 * (ncol00[lVar2 + 1] - ncol00[lVar2]) + ncol00[lVar2];
      dVar9 = ((dVar7 * (ncol10[lVar2 + 1] - ncol10[lVar2]) + ncol10[lVar2]) - dVar9) * dx + dVar9;
      dVar9 = ((((dVar7 * (ncol11[lVar2 + 1] - ncol11[lVar2]) + ncol11[lVar2]) - dVar8) * dx + dVar8
               ) - dVar9) * dz + dVar9;
      if (0.0 < dVar9) {
        in_EAX = iVar6;
      }
      iVar6 = iVar6 + -1;
      iVar1 = iVar3 + -1;
    } while (dVar9 <= 0.0);
    iVar5 = iVar5 - blockspercell;
    if (0 < iVar3) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

int getSurfaceHeight(
        const double ncol00[], const double ncol01[],
        const double ncol10[], const double ncol11[],
        int colymin, int colymax, int blockspercell, double dx, double dz)
{
    int y, celly;
    for (celly = colymax-1; celly >= colymin; celly--)
    {
        int idx = celly - colymin;
        double v000 = ncol00[idx];
        double v001 = ncol01[idx];
        double v100 = ncol10[idx];
        double v101 = ncol11[idx];
        double v010 = ncol00[idx+1];
        double v011 = ncol01[idx+1];
        double v110 = ncol10[idx+1];
        double v111 = ncol11[idx+1];

        for (y = blockspercell - 1; y >= 0; y--)
        {
            double dy = y / (double) blockspercell;
            double noise = lerp3(dy, dx, dz, // Note: not x, y, z
                v000, v010, v100, v110,
                v001, v011, v101, v111);
            if (noise > 0)
                return celly * blockspercell + y;
        }
    }
    return 0;
}